

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Chapters::Write(Chapters *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t size;
  undefined4 extraout_var;
  uint64_t uVar4;
  undefined4 extraout_var_00;
  
  if (writer != (IMkvWriter *)0x0) {
    size = WriteEdition(this,(IMkvWriter *)0x0);
    bVar1 = WriteEbmlMasterElement(writer,0x1043a770,size);
    if (!bVar1) {
      return false;
    }
    iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
    uVar4 = WriteEdition(this,writer);
    if (uVar4 != 0) {
      iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
      return CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) == size ||
             CONCAT44(extraout_var_00,iVar3) < CONCAT44(extraout_var,iVar2);
    }
  }
  return false;
}

Assistant:

bool Chapters::Write(IMkvWriter* writer) const {
  if (writer == NULL)
    return false;

  const uint64_t payload_size = WriteEdition(NULL);  // return size only

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvChapters, payload_size))
    return false;

  const int64_t start = writer->Position();

  if (WriteEdition(writer) == 0)  // error
    return false;

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != payload_size)
    return false;

  return true;
}